

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFun.cpp
# Opt level: O1

float Imath_2_5::predf(float f)

{
  if ((~(uint)f & 0x7f800000) != 0) {
    if ((f == 0.0) && (!NAN(f))) {
      return -1.4013e-45;
    }
    f = (float)((int)f + -1);
  }
  return f;
}

Assistant:

float
predf (float f)
{
    union {float f; unsigned int i;} u;
    u.f = f;

    if ((u.i & 0x7f800000) == 0x7f800000)
    {
        // Nan or infinity; don't change value.
    }
    else if (u.i == 0x00000000 || u.i == 0x80000000)
    {
        // Plus or minus zero.

        u.i = 0x80000001;
    }
    else if (u.i > 0)
    {
        // Positive float, normalized or denormalized.

        --u.i;
    }
    else
    {
        // Negative normalized or denormalized float.
        // Decrementing the largest negative float
        // produces -infinity.

        ++u.i;
    }

    return u.f;
}